

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

int __thiscall QtMWidgets::ToolBarLayout::indexOf(ToolBarLayout *this,QAction *action)

{
  qsizetype qVar1;
  const_reference ppQVar2;
  QObject *object;
  ToolButton *this_00;
  QAction *pQVar3;
  ToolButton *b;
  int i;
  QAction *action_local;
  ToolBarLayout *this_local;
  
  b._4_4_ = 0;
  while( true ) {
    qVar1 = QList<QLayoutItem_*>::count(&this->buttons);
    if (qVar1 <= b._4_4_) {
      return -1;
    }
    ppQVar2 = QList<QLayoutItem_*>::at(&this->buttons,(long)b._4_4_);
    object = (QObject *)(**(code **)(*(long *)*ppQVar2 + 0x68))();
    this_00 = qobject_cast<QtMWidgets::ToolButton*>(object);
    if ((this_00 != (ToolButton *)0x0) && (pQVar3 = ToolButton::action(this_00), pQVar3 == action))
    break;
    b._4_4_ = b._4_4_ + 1;
  }
  return b._4_4_ + 1;
}

Assistant:

int
ToolBarLayout::indexOf( QAction * action ) const
{
	for( int i = 0; i < buttons.count(); ++i )
	{
		ToolButton * b = qobject_cast< ToolButton* >
			( buttons.at( i )->widget() );

		if( b && b->action() == action )
			return i + 1;
	}

	return -1;
}